

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O2

void __thiscall
duckdb::TemplatedValidityMask<unsigned_long>::Copy
          (TemplatedValidityMask<unsigned_long> *this,TemplatedValidityMask<unsigned_long> *other,
          idx_t count)

{
  buffer_ptr<ValidityBuffer> *this_00;
  TemplatedValidityData<unsigned_long> *pTVar1;
  _Head_base<0UL,_unsigned_long_*,_false> _Var2;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_38;
  idx_t local_20;
  
  this->capacity = count;
  this_00 = &this->validity_data;
  local_20 = count;
  if (other->validity_mask == (unsigned_long *)0x0) {
    local_38.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_38.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=(this_00,&local_38);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    _Var2._M_head_impl = (unsigned_long *)0x0;
  }
  else {
    make_shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
              ((unsigned_long **)&local_38,(unsigned_long *)other);
    shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=(this_00,&local_38);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    pTVar1 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(this_00);
    _Var2._M_head_impl =
         (pTVar1->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  }
  this->validity_mask = _Var2._M_head_impl;
  return;
}

Assistant:

inline void Copy(const TemplatedValidityMask &other, idx_t count) {
		capacity = count;
		if (other.AllValid()) {
			validity_data = nullptr;
			validity_mask = nullptr;
		} else {
			validity_data = make_buffer<ValidityBuffer>(other.validity_mask, count);
			validity_mask = validity_data->owned_data.get();
		}
	}